

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O0

void __thiscall PatternModel::setCursor(PatternModel *this,PatternCursor cursor)

{
  CursorChangeFlags local_34;
  PatternModel *pPStack_30;
  CursorChangeFlags flags;
  PatternModel *this_local;
  int local_14;
  int iStack_10;
  PatternCursor cursor_local;
  
  pPStack_30 = this;
  QFlags<PatternModel::CursorChangeFlag>::QFlags(&local_34,CursorUnchanged);
  if (((this->mPlaying & 1U) == 0) || ((this->mFollowing & 1U) == 0)) {
    local_14 = cursor.super_PatternCursorBase.row;
    setCursorRowImpl(this,local_14,&local_34);
  }
  iStack_10 = cursor.super_PatternCursorBase.column;
  setCursorColumnImpl(this,iStack_10,&local_34);
  setCursorTrackImpl(this,cursor.super_PatternCursorBase.track,&local_34);
  emitIfChanged(this,local_34);
  return;
}

Assistant:

void PatternModel::setCursor(PatternCursor const cursor) {
    CursorChangeFlags flags = CursorUnchanged;
    if (!(mPlaying && mFollowing)) {
        setCursorRowImpl(cursor.row, flags);
    }
    setCursorColumnImpl(cursor.column, flags);
    setCursorTrackImpl(cursor.track, flags);
    emitIfChanged(flags);
}